

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O2

adt_error_t adt_str_append_cstr(adt_str_t *self,char *cstr)

{
  adt_str_encoding_t aVar1;
  adt_error_t aVar2;
  int s32NewLen;
  int32_t s32Size;
  int32_t local_2c;
  
  aVar2 = '\x01';
  if (cstr != (char *)0x0 && self != (adt_str_t *)0x0) {
    local_2c = 0;
    aVar2 = '\0';
    aVar1 = adt_utf8_checkEncodingAndSize((uint8_t *)cstr,0,&local_2c);
    if (0 < local_2c && aVar1 != '\0') {
      s32NewLen = local_2c + self->s32Cur;
      aVar2 = adt_str_reserve(self,s32NewLen);
      if (aVar2 == '\0') {
        if (self->s32Size <= s32NewLen) {
          __assert_fail("self->s32Size > newSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                        ,0x1ca,"adt_error_t adt_str_append_cstr(adt_str_t *, const char *)");
        }
        memcpy(self->pAlloc + self->s32Cur,cstr,(long)local_2c);
        self->s32Cur = s32NewLen;
        aVar2 = '\0';
        if ((aVar1 == '\x02') && (self->encoding == '\x01')) {
          self->encoding = '\x02';
          aVar2 = '\0';
        }
      }
    }
  }
  return aVar2;
}

Assistant:

adt_error_t adt_str_append_cstr(adt_str_t *self, const char *cstr)
{
   adt_error_t retval = ADT_NO_ERROR;
   if ( (self == 0) || (cstr == 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t s32Size = 0;
      adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize((const uint8_t*) cstr, 0, &s32Size);
      if ( (encoding != ADT_STR_ENCODING_UNKNOWN) && (s32Size > 0) )
      {
         adt_error_t result;
         int32_t newSize = self->s32Cur+s32Size;
         result = adt_str_reserve(self, newSize);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Size > newSize);
            memcpy(self->pAlloc+self->s32Cur, cstr, s32Size);
            self->s32Cur = newSize;
            if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
            {
               self->encoding = encoding;
            }
         }
         else
         {
            retval = result;
         }
      }
   }
   return retval;
}